

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall
slang::parsing::Parser::parseExternMember(Parser *this,SyntaxKind parentKind,AttrList attributes)

{
  Token primitive;
  Token name;
  bool bVar1;
  TokenKind TVar2;
  undefined8 uVar3;
  SyntaxNode *pSVar4;
  ExternUdpDeclSyntax *pEVar5;
  ModuleHeaderSyntax *header;
  ExternModuleDeclSyntax *pEVar6;
  FunctionPrototypeSyntax *prototype;
  ExternInterfaceMethodSyntax *pEVar7;
  __extent_storage<18446744073709551615UL> _Var8;
  ulong uVar9;
  pointer ppAVar10;
  Token TVar11;
  AttrList AVar12;
  SourceRange SVar13;
  Token externKeyword;
  Token externKeyword_00;
  Token externKeyword_01;
  bool unused;
  uint32_t index;
  bool local_109;
  Info *local_108;
  undefined8 local_100;
  uint32_t local_f4;
  Info *local_f0;
  Info *local_e8;
  undefined8 local_e0;
  pointer local_d8;
  Token local_d0;
  undefined8 local_c0;
  Info *pIStack_b8;
  undefined8 local_b0;
  Info *pIStack_a8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_a0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  _Var8 = attributes._M_extent._M_extent_value;
  ppAVar10 = attributes._M_ptr;
  local_f4 = 1;
  bVar1 = scanAttributes(this,&local_f4);
  if (bVar1) {
    TVar11 = ParserBase::peek(&this->super_ParserBase,local_f4);
    TVar2 = TVar11.kind;
    uVar9 = (ulong)(TVar2 - 0xaf);
    local_a0.super_SyntaxListBase.childCount = _Var8._M_extent_value;
    local_a0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         ppAVar10;
    local_a0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = _Var8._M_extent_value;
    if (TVar2 - 0xaf < 0x3f) {
      if ((0x44002000000U >> (uVar9 & 0x3f) & 1) == 0) {
        if ((3UL >> (uVar9 & 0x3f) & 1) == 0) {
          if (uVar9 == 0x3e) {
            TVar11 = ParserBase::consume(&this->super_ParserBase);
            local_108 = TVar11.info;
            local_100 = TVar11._0_8_;
            AVar12 = parseAttributes(this);
            local_d8 = AVar12._M_ptr;
            TVar11 = ParserBase::consume(&this->super_ParserBase);
            local_e8 = TVar11.info;
            local_e0 = TVar11._0_8_;
            TVar11 = ParserBase::expect(&this->super_ParserBase,Identifier);
            local_f0 = TVar11.info;
            uVar3 = TVar11._0_8_;
            pSVar4 = &parseUdpPortList(this,&local_109)->super_SyntaxNode;
            if (pSVar4->kind == WildcardUdpPortList) {
              SVar13 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
              ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5a0005,SVar13);
            }
            local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
            local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
            local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
            local_a0.super_SyntaxListBase._vptr_SyntaxListBase =
                 (_func_int **)&PTR_getChild_005d2a10;
            local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
            local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
            local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
            local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
            _M_extent._M_extent_value = AVar12._M_extent._M_extent_value._M_extent_value;
            local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
            _M_ptr = local_d8;
            local_68.super_SyntaxListBase._vptr_SyntaxListBase =
                 (_func_int **)&PTR_getChild_005d2a10;
            local_b0 = local_e0;
            pIStack_a8 = local_e8;
            pIStack_b8 = local_f0;
            primitive.info = local_e8;
            primitive.kind = (undefined2)local_e0;
            primitive._2_1_ = local_e0._2_1_;
            primitive.numFlags.raw = local_e0._3_1_;
            primitive.rawLen = local_e0._4_4_;
            name.info = local_f0;
            name.kind = (short)uVar3;
            name._2_1_ = (char)((ulong)uVar3 >> 0x10);
            name.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
            name.rawLen = (int)((ulong)uVar3 >> 0x20);
            externKeyword.info = local_108;
            externKeyword.kind = (undefined2)local_100;
            externKeyword._2_1_ = local_100._2_1_;
            externKeyword.numFlags.raw = local_100._3_1_;
            externKeyword.rawLen = local_100._4_4_;
            local_c0 = uVar3;
            local_68.super_SyntaxListBase.childCount =
                 AVar12._M_extent._M_extent_value._M_extent_value;
            pEVar5 = slang::syntax::SyntaxFactory::externUdpDecl
                               (&this->factory,&local_a0,externKeyword,&local_68,primitive,name,
                                (UdpPortListSyntax *)pSVar4);
            return &pEVar5->super_MemberSyntax;
          }
          goto LAB_003b6ede;
        }
        goto LAB_003b6fb9;
      }
    }
    else {
LAB_003b6ede:
      if (TVar2 == TaskKeyword) {
LAB_003b6fb9:
        if (local_f4 == 1) {
          TVar11 = ParserBase::consume(&this->super_ParserBase);
          local_108 = TVar11.info;
          local_100 = TVar11._0_8_;
          TVar11 = ParserBase::consumeIf(&this->super_ParserBase,ForkJoinKeyword);
          prototype = parseFunctionPrototype
                                (this,parentKind,
                                 (bitmask<slang::parsing::detail::FunctionOptions>)0x2,(bool *)0x0);
          local_d0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
          local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
          local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d2a10;
          externKeyword_01.info = local_108;
          externKeyword_01.kind = (undefined2)local_100;
          externKeyword_01._2_1_ = local_100._2_1_;
          externKeyword_01.numFlags.raw = local_100._3_1_;
          externKeyword_01.rawLen = local_100._4_4_;
          pEVar7 = slang::syntax::SyntaxFactory::externInterfaceMethod
                             (&this->factory,&local_a0,externKeyword_01,TVar11,prototype,local_d0);
          return &pEVar7->super_MemberSyntax;
        }
        goto LAB_003b706f;
      }
      if (TVar2 != ProgramKeyword) goto LAB_003b706f;
    }
    TVar11 = ParserBase::consume(&this->super_ParserBase);
    local_108 = TVar11.info;
    local_100 = TVar11._0_8_;
    AVar12 = parseAttributes(this);
    header = parseModuleHeader(this);
    pSVar4 = &header->ports->super_SyntaxNode;
    if ((pSVar4 != (SyntaxNode *)0x0) && (pSVar4->kind == WildcardPortList)) {
      SVar13 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5a0005,SVar13);
    }
    local_a0.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_a0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_a0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_a0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d2a10;
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d2a10;
    externKeyword_00.info = local_108;
    externKeyword_00.kind = (undefined2)local_100;
    externKeyword_00._2_1_ = local_100._2_1_;
    externKeyword_00.numFlags.raw = local_100._3_1_;
    externKeyword_00.rawLen = local_100._4_4_;
    local_68.super_SyntaxListBase.childCount = AVar12._M_extent._M_extent_value._M_extent_value;
    local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar12;
    pEVar6 = slang::syntax::SyntaxFactory::externModuleDecl
                       (&this->factory,&local_a0,externKeyword_00,&local_68,header);
  }
  else {
LAB_003b706f:
    pEVar6 = (ExternModuleDeclSyntax *)0x0;
  }
  return &pEVar6->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseExternMember(SyntaxKind parentKind, AttrList attributes) {
    uint32_t index = 1;
    if (!scanAttributes(index))
        return nullptr;

    switch (peek(index).kind) {
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::InterfaceKeyword:
        case TokenKind::ProgramKeyword: {
            auto keyword = consume();
            auto actualAttrs = parseAttributes();
            auto& header = parseModuleHeader();
            if (header.ports && header.ports->kind == SyntaxKind::WildcardPortList)
                addDiag(diag::ExternWildcardPortList, header.ports->sourceRange());
            return &factory.externModuleDecl(attributes, keyword, actualAttrs, header);
        }
        case TokenKind::PrimitiveKeyword: {
            bool unused;
            auto keyword = consume();
            auto actualAttrs = parseAttributes();
            auto primitive = consume();
            auto name = expect(TokenKind::Identifier);
            auto& portList = parseUdpPortList(unused);
            if (portList.kind == SyntaxKind::WildcardUdpPortList)
                addDiag(diag::ExternWildcardPortList, portList.sourceRange());
            return &factory.externUdpDecl(attributes, keyword, actualAttrs, primitive, name,
                                          portList);
        }
        case TokenKind::ForkJoinKeyword:
        case TokenKind::FunctionKeyword:
        case TokenKind::TaskKeyword: {
            // If there were more attributes here it's invalid,
            // we'll come back around later after tokens are skipped.
            if (index != 1)
                return nullptr;

            auto keyword = consume();
            auto forkJoin = consumeIf(TokenKind::ForkJoinKeyword);
            auto& proto = parseFunctionPrototype(parentKind, FunctionOptions::IsPrototype);
            auto semi = expect(TokenKind::Semicolon);
            return &factory.externInterfaceMethod(attributes, keyword, forkJoin, proto, semi);
        }
        default:
            return nullptr;
    }
}